

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPStateImp.cpp
# Opt level: O1

void __thiscall TSPStateImp::~TSPStateImp(TSPStateImp *this)

{
  (this->super_StateImp<std::vector<int,_std::allocator<int>_>_>)._vptr_StateImp =
       (_func_int **)&PTR__TSPStateImp_00104d50;
  if (this->x != (double *)0x0) {
    operator_delete(this->x);
  }
  if (this->y != (double *)0x0) {
    operator_delete(this->y);
  }
  if (this->adjacencyMatrix != (double *)0x0) {
    operator_delete(this->adjacencyMatrix);
    return;
  }
  return;
}

Assistant:

TSPStateImp::~TSPStateImp()
{
	if (x != nullptr)
		delete x;
	if (y != nullptr)
		delete y;
	if (adjacencyMatrix != nullptr)
		delete adjacencyMatrix;
}